

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O3

Fl_Help_Link * __thiscall Fl_Help_View::find_link(Fl_Help_View *this,int xx,int yy)

{
  Fl_Help_Link *pFVar1;
  int iVar2;
  
  iVar2 = this->nlinks_;
  pFVar1 = this->links_;
  if (iVar2 < 1) {
    if (iVar2 != 0) {
      return pFVar1;
    }
  }
  else {
    iVar2 = iVar2 + 1;
    do {
      if ((((pFVar1->x <= xx) && (xx < pFVar1->w)) && (pFVar1->y <= yy)) && (yy < pFVar1->h)) {
        return pFVar1;
      }
      pFVar1 = pFVar1 + 1;
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return (Fl_Help_Link *)0x0;
}

Assistant:

Fl_Help_Link *Fl_Help_View::find_link(int xx, int yy)
{
  int		i;
  Fl_Help_Link	*linkp;
  for (i = nlinks_, linkp = links_; i > 0; i --, linkp ++) {
    if (xx >= linkp->x && xx < linkp->w &&
        yy >= linkp->y && yy < linkp->h)
      break;
  }
  return i ? linkp : 0L;
}